

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void writeContactInfoScreen(char *Name,SstStream Stream,attr_list DPAttrs)

{
  char *__ptr;
  attr_list in_RDX;
  SstStream in_RSI;
  undefined8 in_RDI;
  char *Contact;
  
  __ptr = buildContactInfo(in_RSI,in_RDX);
  fprintf(_stdout,
          "The next line of output is the contact information associated with SST output stream \"%s\".  Please make it available to the reader.\n"
          ,in_RDI);
  fprintf(_stdout,"\t%s\n",__ptr);
  fflush(_stdout);
  free(__ptr);
  return;
}

Assistant:

static void writeContactInfoScreen(const char *Name, SstStream Stream, attr_list DPAttrs)
{
    char *Contact = buildContactInfo(Stream, DPAttrs);

    /*
     * write the contact information file to the screen
     */
    fprintf(stdout,
            "The next line of output is the contact information "
            "associated with SST output stream \"%s\".  Please make it "
            "available to the reader.\n",
            Name);
    fprintf(stdout, "\t%s\n", Contact);
    fflush(stdout);
    free(Contact);
}